

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O0

int __thiscall
FVoxelTexture::CopyTrueColorPixels
          (FVoxelTexture *this,FBitmap *bmp,int x,int y,int rotate,FCopyInfo *inf)

{
  PalEntry *local_550;
  int local_548;
  int local_544;
  int i_1;
  int i;
  BYTE *pp;
  BYTE bitmap [256];
  PalEntry pe [256];
  FCopyInfo *inf_local;
  int rotate_local;
  int y_local;
  int x_local;
  FBitmap *bmp_local;
  FVoxelTexture *this_local;
  
  local_550 = (PalEntry *)(bitmap + 0xf8);
  pe._1016_8_ = inf;
  do {
    PalEntry::PalEntry(local_550);
    local_550 = local_550 + 1;
  } while (local_550 != pe + 0xfe);
  _i_1 = this->SourceVox->Palette;
  if (_i_1 == (byte *)0x0) {
    for (local_548 = 0; local_548 < 0x100; local_548 = local_548 + 1) {
      bitmap[(long)local_548 + -8] = (BYTE)local_548;
      pe[(long)local_548 + -2].field_0 = GPalette.BaseColors[local_548].field_0;
      pe[(long)local_548 + -2].field_0.field_0.a = 0xff;
    }
  }
  else {
    for (local_544 = 0; local_544 < 0x100; local_544 = local_544 + 1) {
      bitmap[(long)local_544 + -8] = (BYTE)local_544;
      pe[(long)local_544 + -2].field_0.field_0.r = *_i_1 << 2 | (byte)((int)(uint)*_i_1 >> 4);
      pe[(long)local_544 + -2].field_0.field_0.g = _i_1[1] << 2 | (byte)((int)(uint)_i_1[1] >> 4);
      pe[(long)local_544 + -2].field_0.field_0.b = _i_1[2] << 2 | (byte)((int)(uint)_i_1[2] >> 4);
      pe[(long)local_544 + -2].field_0.field_0.a = 0xff;
      _i_1 = _i_1 + 3;
    }
  }
  (*bmp->_vptr_FBitmap[3])
            (bmp,(ulong)(uint)x,(ulong)(uint)y,&pp,(ulong)(this->super_FTexture).Width,
             (ulong)(this->super_FTexture).Height,1,0x10,rotate,bitmap + 0xf8,pe._1016_8_);
  return 0;
}

Assistant:

int FVoxelTexture::CopyTrueColorPixels(FBitmap *bmp, int x, int y, int rotate, FCopyInfo *inf)
{
	PalEntry pe[256];
	BYTE bitmap[256];
	BYTE *pp = SourceVox->Palette;

	if(pp != NULL)
	{
		for(int i=0;i<256;i++, pp+=3)
		{
			bitmap[i] = (BYTE)i;
			pe[i].r = (pp[0] << 2) | (pp[0] >> 4);
			pe[i].g = (pp[1] << 2) | (pp[1] >> 4);
			pe[i].b = (pp[2] << 2) | (pp[2] >> 4);
			pe[i].a = 255;
		}
	}
	else 
	{
		for(int i=0;i<256;i++, pp+=3)
		{
			bitmap[i] = (BYTE)i;
			pe[i] = GPalette.BaseColors[i];
			pe[i].a = 255;
		}
	}    
	bmp->CopyPixelData(x, y, bitmap, Width, Height, 1, 16, rotate, pe, inf);
	return 0;
}